

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_stmt(SyntaxAnalyze *this)

{
  bool bVar1;
  ulong uVar2;
  WhileLabels WVar3;
  ulong uVar4;
  pointer pWVar5;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_48;
  bool local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  uVar2 = this->matched_index + 1;
  pWVar5 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) * -0x5555555555555555;
  if (uVar2 < uVar4) {
    bVar1 = word::Word::match_token(pWVar5 + uVar2,LBRACE);
    if (bVar1) {
      gm_block(this);
      return;
    }
    pWVar5 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->matched_index + 1;
    uVar4 = ((long)(this->word_list->
                   super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
            -0x5555555555555555;
  }
  if (uVar2 < uVar4) {
    bVar1 = word::Word::match_token(pWVar5 + uVar2,IFTK);
    if (bVar1) {
      gm_if_stmt(this);
      return;
    }
    pWVar5 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->matched_index + 1;
    uVar4 = ((long)(this->word_list->
                   super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
            -0x5555555555555555;
  }
  if (uVar2 < uVar4) {
    bVar1 = word::Word::match_token(pWVar5 + uVar2,WHILETK);
    if (bVar1) {
      gm_while_stmt_flat(this);
      return;
    }
    pWVar5 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->matched_index + 1;
    uVar4 = ((long)(this->word_list->
                   super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
            -0x5555555555555555;
  }
  if (uVar2 < uVar4) {
    bVar1 = word::Word::match_token(pWVar5 + uVar2,BREAK);
    if (!bVar1) {
      pWVar5 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = this->matched_index + 1;
      uVar4 = ((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
              -0x5555555555555555;
      goto LAB_001a84ab;
    }
    match_one_word(this,BREAK);
    match_one_word(this,SEMICN);
    WVar3 = irGenerator::irGenerator::checkWhile(&this->irGenerator);
    local_28 = false;
    irGenerator::irGenerator::ir_jump
              (&this->irGenerator,Br,WVar3._endLabel,-1,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_48,Loop);
    if (local_28 != true) {
      return;
    }
    local_28 = false;
    local_70._16_8_ = local_48._16_8_;
    local_70._M_value._M_dataplus._M_p = local_48._M_value._M_dataplus._M_p;
    if (local_48._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_48._M_value + 0x10)) {
      return;
    }
LAB_001a853d:
    operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
  }
  else {
LAB_001a84ab:
    if (uVar2 < uVar4) {
      bVar1 = word::Word::match_token(pWVar5 + uVar2,CONTINUETK);
      if (bVar1) {
        match_one_word(this,CONTINUETK);
        match_one_word(this,SEMICN);
        WVar3 = irGenerator::irGenerator::checkWhile(&this->irGenerator);
        local_50 = false;
        irGenerator::irGenerator::ir_jump
                  (&this->irGenerator,Br,WVar3._beginLabel,-1,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,Loop);
        if (local_50 != true) {
          return;
        }
        local_50 = false;
        if (local_70._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
          return;
        }
        goto LAB_001a853d;
      }
      pWVar5 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = this->matched_index + 1;
      uVar4 = ((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
              -0x5555555555555555;
    }
    if ((uVar2 < uVar4) && (bVar1 = word::Word::match_token(pWVar5 + uVar2,RETURNTK), bVar1)) {
      gm_return_stmt(this);
      return;
    }
    bVar1 = find_word(this,ASSIGN,SEMICN);
    if (bVar1) {
      gm_assign_stmt(this);
      return;
    }
    uVar2 = this->matched_index + 1;
    pWVar5 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar2 < (ulong)(((long)(this->word_list->
                                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar5 >> 4) *
                        -0x5555555555555555)) &&
       (bVar1 = word::Word::match_token(pWVar5 + uVar2,SEMICN), bVar1)) {
      match_one_word(this,SEMICN);
      return;
    }
    gm_exp((SyntaxAnalyze *)&stack0xffffffffffffffe0);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    match_one_word(this,SEMICN);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_stmt() {
  if (try_word(1, Token::LBRACE)) {
    gm_block();
  } else if (try_word(1, Token::IFTK)) {
    gm_if_stmt();
  } else if (try_word(1, Token::WHILETK)) {
    gm_while_stmt();
  } else if (try_word(1, Token::BREAK)) {
    match_one_word(Token::BREAK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._endLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::CONTINUETK)) {
    match_one_word(Token::CONTINUETK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._beginLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::RETURNTK)) {
    gm_return_stmt();
  } else if (find_word(Token::ASSIGN, Token::SEMICN)) {
    gm_assign_stmt();
  } else if (!try_word(1, Token::SEMICN)) {
    gm_exp();
    match_one_word(Token::SEMICN);
  } else {
    match_one_word(Token::SEMICN);
  }
}